

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

bool StartIndexBackgroundSync(NodeContext *node)

{
  int iVar1;
  ChainstateManager *this;
  pointer ppBVar2;
  pointer ppCVar3;
  bool bVar4;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar5;
  Chainstate *pCVar6;
  CBlockIndex *pCVar7;
  CBlockIndex *pCVar8;
  Chainstate *pCVar9;
  CBlockIndex **ppCVar10;
  char *args;
  char cVar11;
  pointer ppBVar12;
  pointer ppBVar13;
  long in_FS_OFFSET;
  CBlockIndex *start_block;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  string older_index_name;
  CBlockIndex *local_138;
  CBlockIndex *local_118;
  unique_lock<std::recursive_mutex> local_110;
  long *local_100;
  long local_f8;
  long local_f0 [2];
  unique_lock<std::recursive_mutex> local_e0;
  undefined1 local_d0 [32];
  undefined8 local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _Alloc_hider local_38;
  
  local_38._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  puVar5 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&node->chainman,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
                      ,0x7f2,"StartIndexBackgroundSync","node.chainman");
  this = (puVar5->_M_t).
         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
         super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  local_a0._0_8_ = &cs_main;
  local_a0[8] = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_a0);
  pCVar6 = ChainstateManager::GetChainstateForIndexing(this);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_a0);
  ppBVar12 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppBVar2 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppBVar12 != ppBVar2) {
    bVar4 = false;
    do {
      BaseIndex::GetSummary((IndexSummary *)local_a0,*ppBVar12);
      cVar11 = '\x03';
      if ((bool)local_90[0x10] == false) {
        local_e0._M_device = &cs_main.super_recursive_mutex;
        local_e0._M_owns = false;
        std::unique_lock<std::recursive_mutex>::lock(&local_e0);
        pCVar7 = ::node::BlockManager::LookupBlockIndex
                           (&this->m_blockman,(uint256 *)(local_90 + 0x18));
        iVar1 = pCVar7->nHeight;
        if (((long)iVar1 < 0) ||
           (ppCVar3 = (pCVar6->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
           (int)((ulong)((long)(pCVar6->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3) >> 3) <=
           iVar1)) {
          pCVar8 = (CBlockIndex *)0x0;
        }
        else {
          pCVar8 = ppCVar3[iVar1];
        }
        if (pCVar8 != pCVar7) {
          pCVar7 = CChain::FindFork(&pCVar6->m_chain,pCVar7);
        }
        if (((bool)(pCVar7 == (CBlockIndex *)0x0 | ~bVar4)) ||
           (cVar11 = '\0', pCVar7->nHeight < local_138->nHeight)) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
          cVar11 = (pCVar7 == (CBlockIndex *)0x0) * '\x02';
          bVar4 = true;
          local_138 = pCVar7;
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&local_e0);
      }
      if ((mutex_type *)local_a0._0_8_ != (mutex_type *)local_90) {
        operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
      }
    } while (((cVar11 == '\x03') || (cVar11 == '\0')) &&
            (ppBVar12 = ppBVar12 + 1, ppBVar12 != ppBVar2));
    if (bVar4) {
      local_110._M_device = &cs_main.super_recursive_mutex;
      local_110._M_owns = false;
      std::unique_lock<std::recursive_mutex>::lock(&local_110);
      local_118 = local_138;
      if (local_138 == (CBlockIndex *)0x0) {
        pCVar9 = ChainstateManager::ActiveChainstate(this);
        ppCVar3 = (pCVar9->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((pCVar9->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish == ppCVar3) {
          local_118 = (CBlockIndex *)0x0;
        }
        else {
          local_118 = *ppCVar3;
        }
      }
      ppCVar3 = (pCVar6->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar3 ==
          (pCVar6->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pCVar7 = (CBlockIndex *)0x0;
      }
      else {
        pCVar7 = ppCVar3[-1];
      }
      args = "StartIndexBackgroundSync";
      ppCVar10 = inline_assertion_check<true,CBlockIndex_const*&>
                           (&local_118,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
                            ,0x80d,"StartIndexBackgroundSync","start_block");
      bVar4 = ::node::BlockManager::CheckBlockDataAvailability(&this->m_blockman,pCVar7,*ppCVar10);
      if (!bVar4) {
        local_100 = local_f0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_100,
                   "%s best block of the index goes beyond pruned data. Please disable the index or reindex (which will download the whole blockchain again)"
                   ,"");
        local_e0._M_device = (mutex_type *)local_d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,local_100,local_f8 + (long)local_100);
        local_d0._16_8_ = local_b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_d0 + 0x10),local_100,local_f8 + (long)local_100);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)local_a0,(tinyformat *)&local_e0,(bilingual_str *)&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        bVar4 = InitError((bilingual_str *)local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_90._17_7_,local_90[0x10]) != &local_70) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_90._17_7_,local_90[0x10]),
                          (ulong)(local_70._M_allocated_capacity + 1));
        }
        if ((mutex_type *)local_a0._0_8_ != (mutex_type *)local_90) {
          operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
        }
        if ((undefined8 *)local_d0._16_8_ != local_b0) {
          operator_delete((void *)local_d0._16_8_,
                          (ulong)((long)&((__pthread_internal_list *)local_b0[0])->__prev + 1));
        }
        if (local_e0._M_device != (mutex_type *)local_d0) {
          operator_delete(local_e0._M_device,local_d0._0_8_ + 1);
        }
        if (local_100 != local_f0) {
          operator_delete(local_100,local_f0[0] + 1);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&local_110);
        goto LAB_00188070;
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_110);
    }
  }
  ppBVar12 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppBVar2 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppBVar12 == ppBVar2) {
    bVar4 = true;
  }
  else {
    do {
      ppBVar13 = ppBVar12 + 1;
      bVar4 = BaseIndex::StartBackgroundSync(*ppBVar12);
      ppBVar12 = ppBVar13;
    } while (bVar4 && ppBVar13 != ppBVar2);
  }
LAB_00188070:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) != local_38._M_p) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool StartIndexBackgroundSync(NodeContext& node)
{
    // Find the oldest block among all indexes.
    // This block is used to verify that we have the required blocks' data stored on disk,
    // starting from that point up to the current tip.
    // indexes_start_block='nullptr' means "start from height 0".
    std::optional<const CBlockIndex*> indexes_start_block;
    std::string older_index_name;
    ChainstateManager& chainman = *Assert(node.chainman);
    const Chainstate& chainstate = WITH_LOCK(::cs_main, return chainman.GetChainstateForIndexing());
    const CChain& index_chain = chainstate.m_chain;

    for (auto index : node.indexes) {
        const IndexSummary& summary = index->GetSummary();
        if (summary.synced) continue;

        // Get the last common block between the index best block and the active chain
        LOCK(::cs_main);
        const CBlockIndex* pindex = chainman.m_blockman.LookupBlockIndex(summary.best_block_hash);
        if (!index_chain.Contains(pindex)) {
            pindex = index_chain.FindFork(pindex);
        }

        if (!indexes_start_block || !pindex || pindex->nHeight < indexes_start_block.value()->nHeight) {
            indexes_start_block = pindex;
            older_index_name = summary.name;
            if (!pindex) break; // Starting from genesis so no need to look for earlier block.
        }
    };

    // Verify all blocks needed to sync to current tip are present.
    if (indexes_start_block) {
        LOCK(::cs_main);
        const CBlockIndex* start_block = *indexes_start_block;
        if (!start_block) start_block = chainman.ActiveChain().Genesis();
        if (!chainman.m_blockman.CheckBlockDataAvailability(*index_chain.Tip(), *Assert(start_block))) {
            return InitError(strprintf(Untranslated("%s best block of the index goes beyond pruned data. Please disable the index or reindex (which will download the whole blockchain again)"), older_index_name));
        }
    }

    // Start threads
    for (auto index : node.indexes) if (!index->StartBackgroundSync()) return false;
    return true;
}